

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QStringList * __thiscall QTextEditMimeData::formats(QTextEditMimeData *this)

{
  long lVar1;
  ulong uVar2;
  QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_> *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  int i;
  int size;
  QStringList *ret;
  QLatin1String *in_stack_ffffffffffffffa8;
  QStringList *s;
  int local_34;
  QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  this_00 = in_RSI;
  uVar2 = QTextDocumentFragment::isEmpty();
  if ((uVar2 & 1) == 0) {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0x7215bf);
    QList<QString>::reserve((QList<QString> *)this_00,in_stack_00000018);
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_>::at
                (in_RSI,(int)((ulong)s >> 0x20));
      QLatin1String::QLatin1String((QLatin1String *)in_RSI,(char *)s);
      QList<QString>::emplace_back<QLatin1String>(in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QMimeData::formats();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QTextEditMimeData::formats() const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        QStringList ret;
        ret.reserve(size);
        for (int i = 0; i < size; ++i)
            ret.emplace_back(QLatin1StringView(supportedMimeTypes.at(i)));

        return ret;
    }

    return QMimeData::formats();
}